

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QUrlModel::WatchItem>::emplace<QUrlModel::WatchItem>
          (QMovableArrayOps<QUrlModel::WatchItem> *this,qsizetype i,WatchItem *args)

{
  WatchItem **ppWVar1;
  qsizetype *pqVar2;
  WatchItem *pWVar3;
  long lVar4;
  Data *pDVar5;
  WatchItem *pWVar6;
  QAbstractItemModel *pQVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  quintptr qVar15;
  long in_FS_OFFSET;
  bool bVar16;
  int local_58;
  int iStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
           super_QArrayDataPointer<QUrlModel::WatchItem>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004f8221:
    pQVar7 = (args->index).m.ptr;
    uVar13 = (args->index).r;
    uVar14 = (args->index).c;
    qVar15 = (args->index).i;
    pDVar8 = (args->path).d.d;
    pcVar9 = (args->path).d.ptr;
    (args->path).d.d = (Data *)0x0;
    qVar10 = (args->path).d.size;
    (args->path).d.ptr = (char16_t *)0x0;
    (args->path).d.size = 0;
    bVar16 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
             super_QArrayDataPointer<QUrlModel::WatchItem>.size != 0;
    QArrayDataPointer<QUrlModel::WatchItem>::detachAndGrow
              ((QArrayDataPointer<QUrlModel::WatchItem> *)this,(uint)(i == 0 && bVar16),1,
               (WatchItem **)0x0,(QArrayDataPointer<QUrlModel::WatchItem> *)0x0);
    pWVar6 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
             super_QArrayDataPointer<QUrlModel::WatchItem>.ptr;
    uStack_50 = (undefined4)qVar15;
    uStack_4c = (undefined4)(qVar15 >> 0x20);
    if (i != 0 || !bVar16) {
      pWVar3 = pWVar6 + i;
      memmove(pWVar3 + 1,pWVar6 + i,
              ((this->super_QGenericArrayOps<QUrlModel::WatchItem>).
               super_QArrayDataPointer<QUrlModel::WatchItem>.size - i) * 0x30);
      (pWVar3->index).r = uVar13;
      (pWVar3->index).c = uVar14;
      *(undefined4 *)&(pWVar3->index).i = uStack_50;
      *(undefined4 *)((long)&(pWVar3->index).i + 4) = uStack_4c;
      (pWVar3->index).m.ptr = pQVar7;
      (pWVar3->path).d.d = pDVar8;
      (pWVar3->path).d.ptr = pcVar9;
      (pWVar3->path).d.size = qVar10;
      goto LAB_004f82ed;
    }
    pWVar6[-1].index.m.ptr = pQVar7;
    pWVar6[-1].index.r = uVar13;
    pWVar6[-1].index.c = uVar14;
    *(undefined4 *)&pWVar6[-1].index.i = uStack_50;
    *(undefined4 *)((long)&pWVar6[-1].index.i + 4) = uStack_4c;
    pWVar6[-1].path.d.d = pDVar8;
    pWVar6[-1].path.d.ptr = pcVar9;
    pWVar6[-1].path.d.size = qVar10;
  }
  else {
    if (((this->super_QGenericArrayOps<QUrlModel::WatchItem>).
         super_QArrayDataPointer<QUrlModel::WatchItem>.size == i) &&
       (pWVar6 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
                 super_QArrayDataPointer<QUrlModel::WatchItem>.ptr,
       (pDVar5->super_QArrayData).alloc - i !=
       ((long)((long)pWVar6 -
              ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      pWVar6[i].index.m.ptr = (args->index).m.ptr;
      iVar11 = (args->index).c;
      qVar15 = (args->index).i;
      uVar12 = *(undefined4 *)((long)&(args->index).i + 4);
      pWVar3 = pWVar6 + i;
      (pWVar3->index).r = (args->index).r;
      (pWVar3->index).c = iVar11;
      *(int *)&(pWVar3->index).i = (int)qVar15;
      *(undefined4 *)((long)&(pWVar3->index).i + 4) = uVar12;
      pDVar8 = (args->path).d.d;
      (args->path).d.d = (Data *)0x0;
      pWVar6[i].path.d.d = pDVar8;
      pcVar9 = (args->path).d.ptr;
      (args->path).d.ptr = (char16_t *)0x0;
      pWVar6[i].path.d.ptr = pcVar9;
      qVar10 = (args->path).d.size;
      (args->path).d.size = 0;
      pWVar6[i].path.d.size = qVar10;
      goto LAB_004f82ed;
    }
    if ((i != 0) ||
       (pWVar6 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
                 super_QArrayDataPointer<QUrlModel::WatchItem>.ptr,
       (WatchItem *)((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
       pWVar6)) goto LAB_004f8221;
    pWVar6[-1].index.m.ptr = (args->index).m.ptr;
    iVar11 = (args->index).c;
    qVar15 = (args->index).i;
    uVar12 = *(undefined4 *)((long)&(args->index).i + 4);
    pWVar6[-1].index.r = (args->index).r;
    pWVar6[-1].index.c = iVar11;
    *(int *)&pWVar6[-1].index.i = (int)qVar15;
    *(undefined4 *)((long)&pWVar6[-1].index.i + 4) = uVar12;
    pDVar8 = (args->path).d.d;
    (args->path).d.d = (Data *)0x0;
    pWVar6[-1].path.d.d = pDVar8;
    pcVar9 = (args->path).d.ptr;
    (args->path).d.ptr = (char16_t *)0x0;
    pWVar6[-1].path.d.ptr = pcVar9;
    qVar10 = (args->path).d.size;
    (args->path).d.size = 0;
    pWVar6[-1].path.d.size = qVar10;
  }
  ppWVar1 = &(this->super_QGenericArrayOps<QUrlModel::WatchItem>).
             super_QArrayDataPointer<QUrlModel::WatchItem>.ptr;
  *ppWVar1 = *ppWVar1 + -1;
LAB_004f82ed:
  pqVar2 = &(this->super_QGenericArrayOps<QUrlModel::WatchItem>).
            super_QArrayDataPointer<QUrlModel::WatchItem>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }